

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SomeObjectHelper<unsigned_int>
              (RecyclableObject *obj,uint length,uint start,RecyclableObject *callBackFn,Var thisArg
              ,ScriptContext *scriptContext)

{
  BOOL BVar1;
  ThreadContext *pTVar2;
  Var pvVar3;
  JavascriptMethod p_Var4;
  Var pvVar5;
  JavascriptLibrary *pJVar6;
  CallInfo local_a8;
  CallInfo local_a0;
  undefined1 local_98 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  BOOL hasItem;
  uint k;
  Var testResult;
  Var element;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Var thisArg_local;
  RecyclableObject *callBackFn_local;
  uint start_local;
  uint length_local;
  RecyclableObject *obj_local;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar2 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_60,pTVar2);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  autoReentrancyHandler._12_4_ = start;
  do {
    if (length <= (uint)autoReentrancyHandler._12_4_) {
      pJVar6 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      obj_local = &JavascriptLibraryBase::GetFalse(&pJVar6->super_JavascriptLibraryBase)->
                   super_RecyclableObject;
LAB_011189f5:
      JsReentLock::~JsReentLock((JsReentLock *)local_60);
      return obj_local;
    }
    JsReentLock::unlock((JsReentLock *)local_60);
    autoReentrancyHandler._8_4_ = Js::JavascriptOperators::HasItem(obj,autoReentrancyHandler._12_4_)
    ;
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
    if (autoReentrancyHandler._8_4_ != 0) {
      JsReentLock::unlock((JsReentLock *)local_60);
      pvVar3 = Js::JavascriptOperators::GetItem
                         (obj,autoReentrancyHandler._12_4_,(ScriptContext *)jsReentLock._24_8_);
      pTVar2 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_98,pTVar2);
      pTVar2 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
      pTVar2 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::AssertJsReentrancy(pTVar2);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var4);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      CallInfo::CallInfo(&local_a0,CallFlags_Value,4);
      CallInfo::CallInfo(&local_a8,CallFlags_Value,4);
      pvVar5 = JavascriptNumber::ToVar
                         (autoReentrancyHandler._12_4_,(ScriptContext *)jsReentLock._24_8_);
      pvVar3 = (*p_Var4)(callBackFn,(CallInfo)callBackFn,local_a0,0,0,0,0,local_a8,thisArg,pvVar3,
                         pvVar5,obj);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_98);
      BVar1 = JavascriptConversion::ToBoolean(pvVar3,(ScriptContext *)jsReentLock._24_8_);
      if (BVar1 != 0) {
        pJVar6 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        obj_local = &JavascriptLibraryBase::GetTrue(&pJVar6->super_JavascriptLibraryBase)->
                     super_RecyclableObject;
        goto LAB_011189f5;
      }
    }
    autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::SomeObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT_UNLOCK(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }

        return scriptContext->GetLibrary()->GetFalse();
    }